

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::internal::
       parse_precision<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  type tVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  error_handler local_1c;
  error_handler local_1b;
  error_handler local_1a;
  error_handler local_19;
  precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  if (begin + 1 == end) {
    iVar3 = 0;
  }
  else {
    iVar3 = (int)begin[1];
  }
  if (iVar3 - 0x30U < 10) {
    pcVar5 = begin + 2;
    uVar4 = 0;
    do {
      if (0xccccccc < uVar4) {
        uVar4 = 0x80000000;
        break;
      }
      uVar4 = ((int)pcVar5[-1] + uVar4 * 10) - 0x30;
      if (pcVar5 == end) goto LAB_0012dd56;
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
    end = pcVar5 + -1;
LAB_0012dd56:
    if ((int)uVar4 < 0) {
      error_handler::on_error(&local_1c,"number is too big");
    }
    ((handler->
     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = uVar4;
  }
  else {
    if (iVar3 != 0x7b) {
      error_handler::on_error(&local_1a,"missing precision specifier");
    }
    pcVar5 = begin + 2;
    if (pcVar5 != end) {
      local_18.handler = handler;
      pcVar5 = parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                         (pcVar5,end,&local_18);
    }
    if ((pcVar5 == end) || (*pcVar5 != '}')) {
      error_handler::on_error(&local_1b,"invalid format string");
    }
    end = pcVar5 + 1;
  }
  tVar2 = (handler->checker_).arg_type_;
  if ((tVar2 != pointer_type) && (8 < tVar2 - named_arg_type)) {
    return end;
  }
  error_handler::on_error(&local_19,"precision not allowed for this argument type");
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}